

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O0

void fadst4x4_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined2 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  undefined8 uVar14;
  uint uVar15;
  int iVar16;
  int32_t *piVar17;
  char in_DL;
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  int iVar25;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  __m128i v [8];
  __m128i u [8];
  __m128i in7;
  __m128i __rounding;
  __m128i __zero;
  __m128i sinpi_p03_p03;
  __m128i sinpi_m03_p02;
  __m128i sinpi_p03_p04;
  __m128i sinpi_p04_m01;
  __m128i sinpi_p01_p02;
  int32_t *sinpi;
  undefined2 uStack_5e4;
  undefined2 uStack_5e2;
  undefined2 uStack_5dc;
  undefined2 uStack_5da;
  undefined2 uStack_5d4;
  undefined2 uStack_5d2;
  undefined2 uStack_5cc;
  undefined2 uStack_5ca;
  undefined2 uStack_5c4;
  undefined2 uStack_5c2;
  undefined2 uStack_5bc;
  undefined2 uStack_5ba;
  undefined2 uStack_5b4;
  undefined2 uStack_5b2;
  undefined2 uStack_5ac;
  undefined2 uStack_5aa;
  ushort local_498;
  undefined2 uStack_496;
  ushort uStack_494;
  undefined2 uStack_492;
  ushort local_478;
  undefined2 uStack_476;
  ushort uStack_474;
  undefined2 uStack_472;
  undefined2 local_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  undefined2 local_438;
  undefined2 uStack_436;
  undefined2 uStack_434;
  undefined2 uStack_432;
  undefined2 local_428;
  undefined2 uStack_426;
  undefined2 uStack_424;
  undefined2 uStack_422;
  undefined2 local_418;
  undefined2 uStack_416;
  undefined2 uStack_414;
  undefined2 uStack_412;
  int iStack_2f4;
  int iStack_2ec;
  int iStack_2d4;
  int iStack_2cc;
  int iStack_2b4;
  int iStack_2ac;
  int iStack_294;
  int iStack_28c;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  int local_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  int iStack_84;
  int iStack_7c;
  int iStack_74;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_38;
  
  piVar17 = sinpi_arr((int)in_DL);
  uVar15 = (uint)*(ushort *)(piVar17 + 1) | piVar17[2] << 0x10;
  auVar18._4_4_ = uVar15;
  auVar18._0_4_ = uVar15;
  auVar18._12_4_ = uVar15;
  auVar18._8_4_ = uVar15;
  iVar16 = (uint)*(ushort *)(piVar17 + 4) + piVar17[1] * -0x10000;
  auVar21._4_4_ = iVar16;
  auVar21._0_4_ = iVar16;
  auVar21._12_4_ = iVar16;
  auVar21._8_4_ = iVar16;
  uVar15 = (uint)*(ushort *)(piVar17 + 3) | piVar17[4] << 0x10;
  auVar19._4_4_ = uVar15;
  auVar19._0_4_ = uVar15;
  auVar19._12_4_ = uVar15;
  auVar19._8_4_ = uVar15;
  uVar15 = -piVar17[3] & 0xffffU | piVar17[2] << 0x10;
  auVar22._4_4_ = uVar15;
  auVar22._0_4_ = uVar15;
  auVar22._12_4_ = uVar15;
  auVar22._8_4_ = uVar15;
  uVar1 = (undefined2)piVar17[3];
  uVar13 = CONCAT26(uVar1,CONCAT24(uVar1,CONCAT22(uVar1,uVar1)));
  uVar14 = CONCAT26(uVar1,CONCAT24(uVar1,CONCAT22(uVar1,uVar1)));
  iVar16 = 1 << (in_DL - 1U & 0x1f);
  uVar2 = *in_RDI;
  uVar3 = in_RDI[2];
  local_d8 = (short)uVar2;
  sStack_d6 = (short)((ulong)uVar2 >> 0x10);
  sStack_d4 = (short)((ulong)uVar2 >> 0x20);
  sStack_d2 = (short)((ulong)uVar2 >> 0x30);
  local_e8 = (short)uVar3;
  sStack_e6 = (short)((ulong)uVar3 >> 0x10);
  sStack_e4 = (short)((ulong)uVar3 >> 0x20);
  sStack_e2 = (short)((ulong)uVar3 >> 0x30);
  uVar2 = *in_RDI;
  uVar3 = in_RDI[2];
  local_418 = (undefined2)uVar2;
  uStack_416 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_414 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_412 = (undefined2)((ulong)uVar2 >> 0x30);
  local_428 = (undefined2)uVar3;
  uStack_426 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_424 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_422 = (undefined2)((ulong)uVar3 >> 0x30);
  uVar2 = in_RDI[4];
  uVar3 = in_RDI[6];
  local_438 = (undefined2)uVar2;
  uStack_436 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_434 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_432 = (undefined2)((ulong)uVar2 >> 0x30);
  local_448 = (undefined2)uVar3;
  uStack_446 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_444 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_442 = (undefined2)((ulong)uVar3 >> 0x30);
  uVar2 = in_RDI[4];
  local_478 = (ushort)uVar2;
  uStack_476 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_474 = (ushort)((ulong)uVar2 >> 0x20);
  uStack_472 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar2 = in_RDI[6];
  local_498 = (ushort)uVar2;
  uStack_496 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_494 = (ushort)((ulong)uVar2 >> 0x20);
  uStack_492 = (undefined2)((ulong)uVar2 >> 0x30);
  auVar8._2_2_ = local_428;
  auVar8._0_2_ = local_418;
  auVar8._4_2_ = uStack_416;
  auVar8._6_2_ = uStack_426;
  auVar8._10_2_ = uStack_424;
  auVar8._8_2_ = uStack_414;
  auVar8._12_2_ = uStack_412;
  auVar8._14_2_ = uStack_422;
  auVar18 = pmaddwd(auVar8,auVar18);
  auVar7._2_2_ = local_448;
  auVar7._0_2_ = local_438;
  auVar7._4_2_ = uStack_436;
  auVar7._6_2_ = uStack_446;
  auVar7._10_2_ = uStack_444;
  auVar7._8_2_ = uStack_434;
  auVar7._12_2_ = uStack_432;
  auVar7._14_2_ = uStack_442;
  auVar19 = pmaddwd(auVar7,auVar19);
  auVar6._2_2_ = 0;
  auVar6._0_2_ = local_d8 + local_e8;
  auVar6._4_2_ = sStack_d6 + sStack_e6;
  auVar6._6_2_ = 0;
  auVar6._10_2_ = 0;
  auVar6._8_2_ = sStack_d4 + sStack_e4;
  auVar6._12_2_ = sStack_d2 + sStack_e2;
  auVar6._14_2_ = 0;
  auVar20._8_8_ = uVar14;
  auVar20._0_8_ = uVar13;
  auVar20 = pmaddwd(auVar6,auVar20);
  auVar5._2_2_ = local_428;
  auVar5._0_2_ = local_418;
  auVar5._4_2_ = uStack_416;
  auVar5._6_2_ = uStack_426;
  auVar5._10_2_ = uStack_424;
  auVar5._8_2_ = uStack_414;
  auVar5._12_2_ = uStack_412;
  auVar5._14_2_ = uStack_422;
  auVar21 = pmaddwd(auVar5,auVar21);
  auVar4._2_2_ = local_448;
  auVar4._0_2_ = local_438;
  auVar4._4_2_ = uStack_436;
  auVar4._6_2_ = uStack_446;
  auVar4._10_2_ = uStack_444;
  auVar4._8_2_ = uStack_434;
  auVar4._12_2_ = uStack_432;
  auVar4._14_2_ = uStack_442;
  auVar22 = pmaddwd(auVar4,auVar22);
  auVar28._2_2_ = 0;
  auVar28._0_2_ = local_478;
  auVar28._4_2_ = uStack_476;
  auVar28._6_2_ = 0;
  auVar28._10_2_ = 0;
  auVar28._8_2_ = uStack_474;
  auVar28._12_2_ = uStack_472;
  auVar28._14_2_ = 0;
  auVar23._8_8_ = uVar14;
  auVar23._0_8_ = uVar13;
  auVar23 = pmaddwd(auVar28,auVar23);
  auVar27._2_2_ = 0;
  auVar27._0_2_ = local_498;
  auVar27._4_2_ = uStack_496;
  auVar27._6_2_ = 0;
  auVar27._10_2_ = 0;
  auVar27._8_2_ = uStack_494;
  auVar27._12_2_ = uStack_492;
  auVar27._14_2_ = 0;
  auVar24._8_8_ = uVar14;
  auVar24._0_8_ = uVar13;
  auVar24 = pmaddwd(auVar27,auVar24);
  local_258 = auVar18._0_4_;
  iStack_254 = auVar18._4_4_;
  iStack_250 = auVar18._8_4_;
  iStack_24c = auVar18._12_4_;
  local_268 = auVar19._0_4_;
  iStack_264 = auVar19._4_4_;
  iStack_260 = auVar19._8_4_;
  iStack_25c = auVar19._12_4_;
  local_258 = local_258 + local_268;
  iStack_250 = iStack_250 + iStack_260;
  uStack_5e4 = (undefined2)(iStack_254 + iStack_264);
  uStack_5e2 = (undefined2)((uint)(iStack_254 + iStack_264) >> 0x10);
  uStack_5dc = (undefined2)(iStack_24c + iStack_25c);
  uStack_5da = (undefined2)((uint)(iStack_24c + iStack_25c) >> 0x10);
  local_58 = auVar20._0_4_;
  iStack_54 = auVar20._4_4_;
  iStack_50 = auVar20._8_4_;
  iStack_4c = auVar20._12_4_;
  local_68 = auVar24._0_4_;
  iStack_64 = auVar24._4_4_;
  iStack_60 = auVar24._8_4_;
  iStack_5c = auVar24._12_4_;
  uStack_5d4 = (undefined2)(iStack_54 - iStack_64);
  uStack_5d2 = (undefined2)((uint)(iStack_54 - iStack_64) >> 0x10);
  uStack_5cc = (undefined2)(iStack_4c - iStack_5c);
  uStack_5ca = (undefined2)((uint)(iStack_4c - iStack_5c) >> 0x10);
  local_278 = auVar21._0_4_;
  iStack_274 = auVar21._4_4_;
  iStack_270 = auVar21._8_4_;
  iStack_26c = auVar21._12_4_;
  local_288 = auVar22._0_4_;
  iStack_284 = auVar22._4_4_;
  iStack_280 = auVar22._8_4_;
  iStack_27c = auVar22._12_4_;
  local_278 = local_278 + local_288;
  iStack_270 = iStack_270 + iStack_280;
  uStack_5c4 = (undefined2)(iStack_274 + iStack_284);
  uStack_5c2 = (undefined2)((uint)(iStack_274 + iStack_284) >> 0x10);
  uStack_5bc = (undefined2)(iStack_26c + iStack_27c);
  uStack_5ba = (undefined2)((uint)(iStack_26c + iStack_27c) >> 0x10);
  iStack_74 = (int)(CONCAT26(uStack_5c2,CONCAT24(uStack_5c4,local_278)) >> 0x20);
  iStack_6c = (int)(CONCAT26(uStack_5ba,CONCAT24(uStack_5bc,iStack_270)) >> 0x20);
  iStack_84 = (int)(CONCAT26(uStack_5e2,CONCAT24(uStack_5e4,local_258)) >> 0x20);
  iStack_7c = (int)(CONCAT26(uStack_5da,CONCAT24(uStack_5dc,iStack_250)) >> 0x20);
  uStack_5b4 = (undefined2)(iStack_74 - iStack_84);
  uStack_5b2 = (undefined2)((uint)(iStack_74 - iStack_84) >> 0x10);
  uStack_5ac = (undefined2)(iStack_6c - iStack_7c);
  uStack_5aa = (undefined2)((uint)(iStack_6c - iStack_7c) >> 0x10);
  local_38 = auVar23._0_4_;
  iStack_294 = (int)(CONCAT26(uStack_5b2,CONCAT24(uStack_5b4,local_278 - local_258)) >> 0x20);
  iStack_28c = (int)(CONCAT26(uStack_5aa,CONCAT24(uStack_5ac,iStack_270 - iStack_250)) >> 0x20);
  iStack_2b4 = (int)(CONCAT26(uStack_5e2,CONCAT24(uStack_5e4,local_258)) >> 0x20);
  iStack_2ac = (int)(CONCAT26(uStack_5da,CONCAT24(uStack_5dc,iStack_250)) >> 0x20);
  iStack_2d4 = (int)(CONCAT26(uStack_5d2,CONCAT24(uStack_5d4,local_58 - local_68)) >> 0x20);
  iStack_2cc = (int)(CONCAT26(uStack_5ca,CONCAT24(uStack_5cc,iStack_50 - iStack_60)) >> 0x20);
  iStack_2f4 = (int)(CONCAT26(uStack_5c2,CONCAT24(uStack_5c4,local_278)) >> 0x20);
  iStack_2ec = (int)(CONCAT26(uStack_5ba,CONCAT24(uStack_5bc,iStack_270)) >> 0x20);
  auVar24 = ZEXT416((uint)(int)in_DL);
  iVar25 = iStack_2b4 + iVar16 >> auVar24;
  iVar26 = iStack_2ac + iVar16 >> auVar24;
  uStack_5e4 = (undefined2)iVar25;
  uStack_5e2 = (undefined2)((uint)iVar25 >> 0x10);
  uStack_5dc = (undefined2)iVar26;
  uStack_5da = (undefined2)((uint)iVar26 >> 0x10);
  auVar27 = ZEXT416((uint)(int)in_DL);
  iVar25 = iStack_2d4 + iVar16 >> auVar27;
  iVar26 = iStack_2cc + iVar16 >> auVar27;
  uStack_5d4 = (undefined2)iVar25;
  uStack_5d2 = (undefined2)((uint)iVar25 >> 0x10);
  uStack_5cc = (undefined2)iVar26;
  uStack_5ca = (undefined2)((uint)iVar26 >> 0x10);
  auVar23 = ZEXT416((uint)(int)in_DL);
  iVar25 = iStack_2f4 + iVar16 >> auVar23;
  iVar26 = iStack_2ec + iVar16 >> auVar23;
  uStack_5c4 = (undefined2)iVar25;
  uStack_5c2 = (undefined2)((uint)iVar25 >> 0x10);
  uStack_5bc = (undefined2)iVar26;
  uStack_5ba = (undefined2)((uint)iVar26 >> 0x10);
  auVar28 = ZEXT416((uint)(int)in_DL);
  iVar25 = iStack_294 + iVar16 >> auVar28;
  iVar26 = iStack_28c + iVar16 >> auVar28;
  uStack_5b4 = (undefined2)iVar25;
  uStack_5b2 = (undefined2)((uint)iVar25 >> 0x10);
  uStack_5ac = (undefined2)iVar26;
  uStack_5aa = (undefined2)((uint)iVar26 >> 0x10);
  auVar12._4_2_ = uStack_5e4;
  auVar12._0_4_ = local_258 + iVar16 >> auVar24;
  auVar12._6_2_ = uStack_5e2;
  auVar12._12_2_ = uStack_5dc;
  auVar12._8_4_ = iStack_250 + iVar16 >> auVar24;
  auVar12._14_2_ = uStack_5da;
  auVar11._4_2_ = uStack_5c4;
  auVar11._0_4_ = local_278 + iVar16 >> auVar23;
  auVar11._6_2_ = uStack_5c2;
  auVar11._12_2_ = uStack_5bc;
  auVar11._8_4_ = iStack_270 + iVar16 >> auVar23;
  auVar11._14_2_ = uStack_5ba;
  auVar24 = packssdw(auVar12,auVar11);
  *in_RSI = auVar24;
  auVar10._4_2_ = uStack_5d4;
  auVar10._0_4_ = (local_58 - local_68) + iVar16 >> auVar27;
  auVar10._6_2_ = uStack_5d2;
  auVar10._12_2_ = uStack_5cc;
  auVar10._8_4_ = (iStack_50 - iStack_60) + iVar16 >> auVar27;
  auVar10._14_2_ = uStack_5ca;
  auVar9._4_2_ = uStack_5b4;
  auVar9._0_4_ = (local_278 - local_258) + local_38 * 3 + iVar16 >> auVar28;
  auVar9._6_2_ = uStack_5b2;
  auVar9._12_2_ = uStack_5ac;
  auVar9._8_4_ = (iStack_270 - iStack_250) + iVar16 >> auVar28;
  auVar9._14_2_ = uStack_5aa;
  auVar24 = packssdw(auVar10,auVar9);
  in_RSI[1] = auVar24;
  *(undefined8 *)in_RSI[2] = *(undefined8 *)(*in_RSI + 8);
  *(undefined8 *)(in_RSI[2] + 8) = 0;
  *(undefined8 *)in_RSI[3] = *(undefined8 *)(in_RSI[1] + 8);
  *(undefined8 *)(in_RSI[3] + 8) = 0;
  return;
}

Assistant:

static void fadst4x4_new_sse2(const __m128i *input, __m128i *output,
                              int8_t cos_bit) {
  const int32_t *sinpi = sinpi_arr(cos_bit);
  const __m128i sinpi_p01_p02 = pair_set_epi16(sinpi[1], sinpi[2]);
  const __m128i sinpi_p04_m01 = pair_set_epi16(sinpi[4], -sinpi[1]);
  const __m128i sinpi_p03_p04 = pair_set_epi16(sinpi[3], sinpi[4]);
  const __m128i sinpi_m03_p02 = pair_set_epi16(-sinpi[3], sinpi[2]);
  const __m128i sinpi_p03_p03 = _mm_set1_epi16((int16_t)sinpi[3]);
  const __m128i __zero = _mm_setzero_si128();
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  const __m128i in7 = _mm_add_epi16(input[0], input[1]);
  __m128i u[8], v[8];

  u[0] = _mm_unpacklo_epi16(input[0], input[1]);
  u[1] = _mm_unpacklo_epi16(input[2], input[3]);
  u[2] = _mm_unpacklo_epi16(in7, __zero);
  u[3] = _mm_unpacklo_epi16(input[2], __zero);
  u[4] = _mm_unpacklo_epi16(input[3], __zero);

  v[0] = _mm_madd_epi16(u[0], sinpi_p01_p02);  // s0 + s2
  v[1] = _mm_madd_epi16(u[1], sinpi_p03_p04);  // s4 + s5
  v[2] = _mm_madd_epi16(u[2], sinpi_p03_p03);  // x1
  v[3] = _mm_madd_epi16(u[0], sinpi_p04_m01);  // s1 - s3
  v[4] = _mm_madd_epi16(u[1], sinpi_m03_p02);  // -s4 + s6
  v[5] = _mm_madd_epi16(u[3], sinpi_p03_p03);  // s4
  v[6] = _mm_madd_epi16(u[4], sinpi_p03_p03);

  u[0] = _mm_add_epi32(v[0], v[1]);
  u[1] = _mm_sub_epi32(v[2], v[6]);
  u[2] = _mm_add_epi32(v[3], v[4]);
  u[3] = _mm_sub_epi32(u[2], u[0]);
  u[4] = _mm_slli_epi32(v[5], 2);
  u[5] = _mm_sub_epi32(u[4], v[5]);
  u[6] = _mm_add_epi32(u[3], u[5]);

  v[0] = _mm_add_epi32(u[0], __rounding);
  v[1] = _mm_add_epi32(u[1], __rounding);
  v[2] = _mm_add_epi32(u[2], __rounding);
  v[3] = _mm_add_epi32(u[6], __rounding);

  u[0] = _mm_srai_epi32(v[0], cos_bit);
  u[1] = _mm_srai_epi32(v[1], cos_bit);
  u[2] = _mm_srai_epi32(v[2], cos_bit);
  u[3] = _mm_srai_epi32(v[3], cos_bit);

  output[0] = _mm_packs_epi32(u[0], u[2]);
  output[1] = _mm_packs_epi32(u[1], u[3]);
  output[2] = _mm_srli_si128(output[0], 8);
  output[3] = _mm_srli_si128(output[1], 8);
}